

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O1

void __thiscall iDynTree::optimalcontrol::LinearSystem::~LinearSystem(LinearSystem *this)

{
  LinearSystemPimpl *pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_0019a810;
  pLVar1 = this->m_pimpl;
  if (pLVar1 != (LinearSystemPimpl *)0x0) {
    SparsityStructure::~SparsityStructure(&pLVar1->controlSparsity);
    SparsityStructure::~SparsityStructure(&pLVar1->stateSparsity);
    p_Var2 = (pLVar1->controlMatrix).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pLVar1->stateMatrix).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    operator_delete(pLVar1,0xf8);
    this->m_pimpl = (LinearSystemPimpl *)0x0;
  }
  DynamicalSystem::~DynamicalSystem(&this->super_DynamicalSystem);
  return;
}

Assistant:

LinearSystem::~LinearSystem()
        {
            if(m_pimpl){
                delete m_pimpl;
                m_pimpl = nullptr;
            }
        }